

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O1

void __thiscall FxConstant::FxConstant(FxConstant *this,bool val,FScriptPosition *pos)

{
  PBool *pPVar1;
  undefined7 in_register_00000031;
  
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_Constant;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
  (this->value).Type = (PType *)TypeSInt32;
  (this->value).field_1.Int = 0;
  pPVar1 = TypeBool;
  (this->value).Type = (PType *)TypeBool;
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  (this->value).field_1.Int = (int)CONCAT71(in_register_00000031,val);
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(bool val, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = value.Type = TypeBool;
		value.Int = val;
		isresolved = true;
	}